

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_file_v4_binary.cc
# Opt level: O0

bool lf::io::detail::ParseGmshFileV4Binary
               (const_iterator begin,const_iterator end,int one,GMshFileV4 *result)

{
  undefined1 local_eb8 [8];
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  grammar;
  undefined1 local_768 [8];
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  grammar_1;
  GMshFileV4 *result_local;
  int one_local;
  const_iterator end_local;
  const_iterator begin_local;
  
  grammar_1._1840_8_ = result;
  end_local = begin;
  if (one == 1) {
    (anonymous_namespace)::
    MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
    MshV4GrammarBinary<boost::spirit::terminal<boost::spirit::tag::little_dword>,boost::spirit::terminal<boost::spirit::tag::little_qword>,boost::spirit::terminal<boost::spirit::tag::little_bin_double>>
              ((MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *
               )local_768,(terminal<boost::spirit::tag::little_dword> *)&boost::spirit::little_dword
               ,(terminal<boost::spirit::tag::little_qword> *)&boost::spirit::little_qword,
               (terminal<boost::spirit::tag::little_bin_double> *)&boost::spirit::little_bin_double)
    ;
    begin_local._M_current._7_1_ =
         boost::spirit::qi::
         phrase_parse<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,lf::io::(anonymous_namespace)::MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,lf::io::GMshFileV4>
                   (&end_local,
                    (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     )end._M_current,
                    (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_768,
                    (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>
                     *)&boost::spirit::ascii::space,(GMshFileV4 *)grammar_1._1840_8_);
    anon_unknown_0::
    MshV4GrammarBinary<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~MshV4GrammarBinary
              ((MshV4GrammarBinary<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_768);
  }
  else {
    (anonymous_namespace)::
    MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
    MshV4GrammarBinary<boost::spirit::terminal<boost::spirit::tag::big_dword>,boost::spirit::terminal<boost::spirit::tag::big_qword>,boost::spirit::terminal<boost::spirit::tag::big_bin_double>>
              ((MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *
               )local_eb8,(terminal<boost::spirit::tag::big_dword> *)&boost::spirit::big_dword,
               (terminal<boost::spirit::tag::big_qword> *)&boost::spirit::big_qword,
               (terminal<boost::spirit::tag::big_bin_double> *)&boost::spirit::big_bin_double);
    begin_local._M_current._7_1_ =
         boost::spirit::qi::
         phrase_parse<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,lf::io::(anonymous_namespace)::MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,lf::io::GMshFileV4>
                   (&end_local,
                    (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     )end._M_current,
                    (MshV4GrammarBinary<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_eb8,
                    (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>
                     *)&boost::spirit::ascii::space,(GMshFileV4 *)grammar_1._1840_8_);
    anon_unknown_0::
    MshV4GrammarBinary<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~MshV4GrammarBinary
              ((MshV4GrammarBinary<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_eb8);
  }
  return begin_local._M_current._7_1_;
}

Assistant:

bool ParseGmshFileV4Binary(std::string::const_iterator begin,
                           std::string::const_iterator end, int one,
                           GMshFileV4* result) {
  if (one == 1) {
    const MshV4GrammarBinary<std::string::const_iterator> grammar(
        qi::little_dword, qi::little_qword, qi::little_bin_double);
    return qi::phrase_parse(begin, end, grammar, ascii::space, *result);
  }
  const MshV4GrammarBinary<std::string::const_iterator> grammar(
      qi::big_dword, qi::big_qword, qi::big_bin_double);
  return qi::phrase_parse(begin, end, grammar, ascii::space, *result);
}